

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio_util.c
# Opt level: O2

int ImgIoUtilReadFile(char *file_name,uint8_t **data,size_t *data_size)

{
  int iVar1;
  FILE *__stream;
  ulong __size;
  uint8_t *__ptr;
  size_t sVar2;
  
  if ((file_name != (char *)0x0) && ((*file_name != '-' || (file_name[1] != '\0')))) {
    iVar1 = 0;
    if (data_size != (size_t *)0x0 && data != (uint8_t **)0x0) {
      *data = (uint8_t *)0x0;
      *data_size = 0;
      __stream = fopen(file_name,"rb");
      if (__stream == (FILE *)0x0) {
        iVar1 = 0;
        fprintf(_stderr,"cannot open input file \'%s\'\n",file_name);
      }
      else {
        fseek(__stream,0,2);
        __size = ftell(__stream);
        fseek(__stream,0,0);
        __ptr = (uint8_t *)WebPMalloc(__size + 1);
        if (__ptr == (uint8_t *)0x0) {
          fclose(__stream);
          fprintf(_stderr,"memory allocation failure when reading file %s\n",file_name);
          iVar1 = 0;
        }
        else {
          sVar2 = fread(__ptr,__size,1,__stream);
          fclose(__stream);
          if (sVar2 == 1) {
            __ptr[__size] = '\0';
            *data = __ptr;
            *data_size = __size;
            iVar1 = 1;
          }
          else {
            iVar1 = 0;
            fprintf(_stderr,"Could not read %d bytes of data from file %s\n",__size & 0xffffffff,
                    file_name);
            WebPFree(__ptr);
          }
        }
      }
    }
    return iVar1;
  }
  iVar1 = ImgIoUtilReadFromStdin(data,data_size);
  return iVar1;
}

Assistant:

int ImgIoUtilReadFile(const char* const file_name,
                      const uint8_t** data, size_t* data_size) {
  int ok;
  uint8_t* file_data;
  size_t file_size;
  FILE* in;
  const int from_stdin = (file_name == NULL) || !WSTRCMP(file_name, "-");

  if (from_stdin) return ImgIoUtilReadFromStdin(data, data_size);

  if (data == NULL || data_size == NULL) return 0;
  *data = NULL;
  *data_size = 0;

  in = WFOPEN(file_name, "rb");
  if (in == NULL) {
    WFPRINTF(stderr, "cannot open input file '%s'\n", (const W_CHAR*)file_name);
    return 0;
  }
  fseek(in, 0, SEEK_END);
  file_size = ftell(in);
  fseek(in, 0, SEEK_SET);
  // we allocate one extra byte for the \0 terminator
  file_data = (uint8_t*)WebPMalloc(file_size + 1);
  if (file_data == NULL) {
    fclose(in);
    WFPRINTF(stderr, "memory allocation failure when reading file %s\n",
             (const W_CHAR*)file_name);
    return 0;
  }
  ok = (fread(file_data, file_size, 1, in) == 1);
  fclose(in);

  if (!ok) {
    WFPRINTF(stderr, "Could not read %d bytes of data from file %s\n",
             (int)file_size, (const W_CHAR*)file_name);
    WebPFree(file_data);
    return 0;
  }
  file_data[file_size] = '\0';  // convenient 0-terminator
  *data = file_data;
  *data_size = file_size;
  return 1;
}